

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::saveVectors(FastText *this,string *filename)

{
  char cVar1;
  int32_t iVar2;
  ostream *poVar3;
  long *plVar4;
  invalid_argument *this_00;
  int id;
  string word;
  Vector vec;
  ofstream ofs;
  string local_268;
  Vector local_248;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(string *)filename,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    iVar2 = Dictionary::nwords((this->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    plVar4 = (long *)std::ostream::operator<<
                               ((ostream *)poVar3,
                                ((this->args_).
                                 super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->dim);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    Vector::Vector(&local_248,
                   (long)((this->args_).
                          super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         dim);
    id = 0;
    while( true ) {
      iVar2 = Dictionary::nwords((this->dict_).
                                 super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
      if (iVar2 <= id) break;
      Dictionary::getWord_abi_cxx11_
                (&local_268,
                 (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,id);
      getWordVector(this,&local_248,&local_268);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,local_268._M_dataplus._M_p,
                          local_268._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = operator<<(poVar3,&local_248);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      id = id + 1;
    }
    if (local_248.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _log;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_268,filename," cannot be opened for saving vectors!");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_268);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::saveVectors(const std::string& filename) {
  std::ofstream ofs(filename);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        filename + " cannot be opened for saving vectors!");
  }
  ofs << dict_->nwords() << " " << args_->dim << std::endl;
  Vector vec(args_->dim);
  for (int32_t i = 0; i < dict_->nwords(); i++) {
    std::string word = dict_->getWord(i);
    getWordVector(vec, word);
    ofs << word << " " << vec << std::endl;
  }
}